

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapezoidal_decomposition.cc
# Opt level: O1

void __thiscall
PolygonTriangulation::add_segment_to_query_structure
          (PolygonTriangulation *this,uint32_t segment_index)

{
  pointer psVar1;
  uint32_t vertex_index;
  uint32_t vertex_index_00;
  bool bVar2;
  
  psVar1 = (this->segments_).super__Vector_base<segment_t,_std::allocator<segment_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar2 = anon_unknown.dwarf_181d3::is_vertex_lower
                    (this->vertices_ + psVar1[segment_index].v0,
                     this->vertices_ + psVar1[segment_index].v1);
  vertex_index = psVar1[segment_index].v1;
  vertex_index_00 = psVar1[segment_index].v0;
  if (bVar2) {
    vertex_index = psVar1[segment_index].v0;
    vertex_index_00 = psVar1[segment_index].v1;
  }
  add_endpoint_to_query_structure(this,vertex_index_00);
  add_endpoint_to_query_structure(this,vertex_index);
  thread_endpoints(this,segment_index,vertex_index_00,vertex_index);
  return;
}

Assistant:

void PolygonTriangulation::add_segment_to_query_structure(const uint32_t segment_index)
{
  const auto &segment = segments_[segment_index];

  uint32_t min_y_index, max_y_index;
  get_max_min_y_indices(segment, max_y_index, min_y_index);

  add_endpoint_to_query_structure(max_y_index);
  add_endpoint_to_query_structure(min_y_index);
  thread_endpoints(segment_index, max_y_index, min_y_index);
}